

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O2

void __thiscall btHingeConstraint::buildJacobian(btHingeConstraint *this)

{
  btRigidBody *pbVar1;
  btRigidBody *pbVar2;
  long lVar3;
  btJacobianEntry *this_00;
  btScalar bVar4;
  btScalar bVar5;
  btVector3 bVar6;
  float local_138;
  btVector3 axisA;
  btVector3 local_118;
  btVector3 local_108;
  btVector3 hingeAxisWorld;
  btVector3 jointAxis1;
  btVector3 jointAxis0;
  btVector3 jointAxis1local;
  float local_b8;
  float fStack_b4;
  btVector3 local_a0;
  btMatrix3x3 local_90;
  btVector3 jointAxis0local;
  
  if (this->m_useSolveConstraintObsolete == true) {
    (this->super_btTypedConstraint).m_appliedImpulse = 0.0;
    this->m_accMotorImpulse = 0.0;
    if (this->m_angularOnly == false) {
      bVar6 = btTransform::operator()
                        (&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                          m_worldTransform,&(this->m_rbAFrame).m_origin);
      jointAxis1local.m_floats = bVar6.m_floats;
      jointAxis0 = btTransform::operator()
                             (&(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                               m_worldTransform,&(this->m_rbBFrame).m_origin);
      local_b8 = bVar6.m_floats[0];
      fStack_b4 = bVar6.m_floats[1];
      local_138 = bVar6.m_floats[2];
      jointAxis1.m_floats[1] = jointAxis0.m_floats[1] - fStack_b4;
      jointAxis1.m_floats[0] = jointAxis0.m_floats[0] - local_b8;
      jointAxis1.m_floats[2] = jointAxis0.m_floats[2] - local_138;
      jointAxis1.m_floats[3] = 0.0;
      bVar4 = btVector3::length2(&jointAxis1);
      if (bVar4 <= 1.1920929e-07) {
        axisA.m_floats = (btScalar  [4])ZEXT816(0x3f800000);
      }
      else {
        axisA = btVector3::normalized(&jointAxis1);
      }
      btPlaneSpace1<btVector3>(&axisA,&local_118,&local_108);
      this_00 = this->m_jac;
      for (lVar3 = 0; lVar3 != 0x30; lVar3 = lVar3 + 0x10) {
        btMatrix3x3::transpose
                  (&local_90,
                   &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                    m_worldTransform.m_basis);
        btMatrix3x3::transpose
                  ((btMatrix3x3 *)&jointAxis0local,
                   &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                    m_worldTransform.m_basis);
        hingeAxisWorld =
             operator-(&jointAxis1local,
                       &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                        m_worldTransform.m_origin);
        local_a0 = operator-(&jointAxis0,
                             &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                              m_worldTransform.m_origin);
        pbVar1 = (this->super_btTypedConstraint).m_rbA;
        pbVar2 = (this->super_btTypedConstraint).m_rbB;
        btJacobianEntry::btJacobianEntry
                  (this_00,&local_90,(btMatrix3x3 *)&jointAxis0local,&hingeAxisWorld,&local_a0,
                   (btVector3 *)((long)axisA.m_floats + lVar3),&pbVar1->m_invInertiaLocal,
                   pbVar1->m_inverseMass,&pbVar2->m_invInertiaLocal,pbVar2->m_inverseMass);
        this_00 = this_00 + 1;
      }
    }
    axisA.m_floats[1] = (this->m_rbAFrame).m_basis.m_el[1].m_floats[2];
    axisA.m_floats[0] =
         (btScalar)(int)*(undefined8 *)((this->m_rbAFrame).m_basis.m_el[0].m_floats + 2);
    axisA.m_floats[2] = (this->m_rbAFrame).m_basis.m_el[2].m_floats[2];
    axisA.m_floats[3] = 0.0;
    btPlaneSpace1<btVector3>(&axisA,&jointAxis0local,&jointAxis1local);
    jointAxis0 = operator*(&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                            m_worldTransform.m_basis,&jointAxis0local);
    jointAxis1 = operator*(&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                            m_worldTransform.m_basis,&jointAxis1local);
    axisA.m_floats[1] = (this->m_rbAFrame).m_basis.m_el[1].m_floats[2];
    axisA.m_floats[0] =
         (btScalar)(int)*(undefined8 *)((this->m_rbAFrame).m_basis.m_el[0].m_floats + 2);
    axisA.m_floats[2] = (this->m_rbAFrame).m_basis.m_el[2].m_floats[2];
    axisA.m_floats[3] = 0.0;
    hingeAxisWorld =
         operator*(&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                    m_worldTransform.m_basis,&axisA);
    btMatrix3x3::transpose
              ((btMatrix3x3 *)&axisA,
               &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).m_worldTransform.
                m_basis);
    btMatrix3x3::transpose
              (&local_90,
               &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).m_worldTransform.
                m_basis);
    btJacobianEntry::btJacobianEntry
              (this->m_jacAng,&jointAxis0,(btMatrix3x3 *)&axisA,&local_90,
               &((this->super_btTypedConstraint).m_rbA)->m_invInertiaLocal,
               &((this->super_btTypedConstraint).m_rbB)->m_invInertiaLocal);
    btMatrix3x3::transpose
              ((btMatrix3x3 *)&axisA,
               &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).m_worldTransform.
                m_basis);
    btMatrix3x3::transpose
              (&local_90,
               &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).m_worldTransform.
                m_basis);
    btJacobianEntry::btJacobianEntry
              (this->m_jacAng + 1,&jointAxis1,(btMatrix3x3 *)&axisA,&local_90,
               &((this->super_btTypedConstraint).m_rbA)->m_invInertiaLocal,
               &((this->super_btTypedConstraint).m_rbB)->m_invInertiaLocal);
    btMatrix3x3::transpose
              ((btMatrix3x3 *)&axisA,
               &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).m_worldTransform.
                m_basis);
    btMatrix3x3::transpose
              (&local_90,
               &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).m_worldTransform.
                m_basis);
    btJacobianEntry::btJacobianEntry
              (this->m_jacAng + 2,&hingeAxisWorld,(btMatrix3x3 *)&axisA,&local_90,
               &((this->super_btTypedConstraint).m_rbA)->m_invInertiaLocal,
               &((this->super_btTypedConstraint).m_rbB)->m_invInertiaLocal);
    this->m_accLimitImpulse = 0.0;
    testLimit(this,&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                    m_worldTransform,
              &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).m_worldTransform);
    local_90.m_el[0].m_floats[1] = (this->m_rbAFrame).m_basis.m_el[1].m_floats[2];
    local_90.m_el[0].m_floats[0] =
         (btScalar)(int)*(undefined8 *)((this->m_rbAFrame).m_basis.m_el[0].m_floats + 2);
    local_90.m_el[0].m_floats[2] = (this->m_rbAFrame).m_basis.m_el[2].m_floats[2];
    local_90.m_el[0].m_floats[3] = 0.0;
    axisA = operator*(&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                       m_worldTransform.m_basis,local_90.m_el);
    bVar4 = btRigidBody::computeAngularImpulseDenominator
                      ((this->super_btTypedConstraint).m_rbA,&axisA);
    bVar5 = btRigidBody::computeAngularImpulseDenominator
                      ((this->super_btTypedConstraint).m_rbB,&axisA);
    this->m_kHinge = 1.0 / (bVar5 + bVar4);
  }
  return;
}

Assistant:

void	btHingeConstraint::buildJacobian()
{
	if (m_useSolveConstraintObsolete)
	{
		m_appliedImpulse = btScalar(0.);
		m_accMotorImpulse = btScalar(0.);

		if (!m_angularOnly)
		{
			btVector3 pivotAInW = m_rbA.getCenterOfMassTransform()*m_rbAFrame.getOrigin();
			btVector3 pivotBInW = m_rbB.getCenterOfMassTransform()*m_rbBFrame.getOrigin();
			btVector3 relPos = pivotBInW - pivotAInW;

			btVector3 normal[3];
			if (relPos.length2() > SIMD_EPSILON)
			{
				normal[0] = relPos.normalized();
			}
			else
			{
				normal[0].setValue(btScalar(1.0),0,0);
			}

			btPlaneSpace1(normal[0], normal[1], normal[2]);

			for (int i=0;i<3;i++)
			{
				new (&m_jac[i]) btJacobianEntry(
				m_rbA.getCenterOfMassTransform().getBasis().transpose(),
				m_rbB.getCenterOfMassTransform().getBasis().transpose(),
				pivotAInW - m_rbA.getCenterOfMassPosition(),
				pivotBInW - m_rbB.getCenterOfMassPosition(),
				normal[i],
				m_rbA.getInvInertiaDiagLocal(),
				m_rbA.getInvMass(),
				m_rbB.getInvInertiaDiagLocal(),
				m_rbB.getInvMass());
			}
		}

		//calculate two perpendicular jointAxis, orthogonal to hingeAxis
		//these two jointAxis require equal angular velocities for both bodies

		//this is unused for now, it's a todo
		btVector3 jointAxis0local;
		btVector3 jointAxis1local;
		
		btPlaneSpace1(m_rbAFrame.getBasis().getColumn(2),jointAxis0local,jointAxis1local);

		btVector3 jointAxis0 = getRigidBodyA().getCenterOfMassTransform().getBasis() * jointAxis0local;
		btVector3 jointAxis1 = getRigidBodyA().getCenterOfMassTransform().getBasis() * jointAxis1local;
		btVector3 hingeAxisWorld = getRigidBodyA().getCenterOfMassTransform().getBasis() * m_rbAFrame.getBasis().getColumn(2);
			
		new (&m_jacAng[0])	btJacobianEntry(jointAxis0,
			m_rbA.getCenterOfMassTransform().getBasis().transpose(),
			m_rbB.getCenterOfMassTransform().getBasis().transpose(),
			m_rbA.getInvInertiaDiagLocal(),
			m_rbB.getInvInertiaDiagLocal());

		new (&m_jacAng[1])	btJacobianEntry(jointAxis1,
			m_rbA.getCenterOfMassTransform().getBasis().transpose(),
			m_rbB.getCenterOfMassTransform().getBasis().transpose(),
			m_rbA.getInvInertiaDiagLocal(),
			m_rbB.getInvInertiaDiagLocal());

		new (&m_jacAng[2])	btJacobianEntry(hingeAxisWorld,
			m_rbA.getCenterOfMassTransform().getBasis().transpose(),
			m_rbB.getCenterOfMassTransform().getBasis().transpose(),
			m_rbA.getInvInertiaDiagLocal(),
			m_rbB.getInvInertiaDiagLocal());

			// clear accumulator
			m_accLimitImpulse = btScalar(0.);

			// test angular limit
			testLimit(m_rbA.getCenterOfMassTransform(),m_rbB.getCenterOfMassTransform());

		//Compute K = J*W*J' for hinge axis
		btVector3 axisA =  getRigidBodyA().getCenterOfMassTransform().getBasis() *  m_rbAFrame.getBasis().getColumn(2);
		m_kHinge =   1.0f / (getRigidBodyA().computeAngularImpulseDenominator(axisA) +
							 getRigidBodyB().computeAngularImpulseDenominator(axisA));

	}
}